

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_rg_etc1.cpp
# Opt level: O3

void crnlib::rg_etc1::etc1_block::unpack_color5
               (uint *r,uint *g,uint *b,uint16 packed_color5,bool scaled)

{
  uint uVar1;
  undefined7 in_register_00000081;
  uint uVar2;
  uint uVar3;
  
  uVar1 = packed_color5 & 0x1f;
  uVar3 = packed_color5 >> 5 & 0x1f;
  uVar2 = packed_color5 >> 10 & 0x1f;
  if ((int)CONCAT71(in_register_00000081,scaled) != 0) {
    uVar1 = (uVar1 >> 2) + uVar1 * 8;
    uVar2 = (uVar2 >> 2) + (packed_color5 >> 10 & 0x1f) * 8;
    uVar3 = (uVar3 >> 2) + (packed_color5 >> 5 & 0x1f) * 8;
  }
  *r = uVar2;
  *g = uVar3;
  *b = uVar1;
  return;
}

Assistant:

color_quad_u8 etc1_block::unpack_color5(uint16 packed_color5, bool scaled, uint alpha)
        {
            uint b = packed_color5 & 31U;
            uint g = (packed_color5 >> 5U) & 31U;
            uint r = (packed_color5 >> 10U) & 31U;

            if (scaled)
            {
                b = (b << 3U) | (b >> 2U);
                g = (g << 3U) | (g >> 2U);
                r = (r << 3U) | (r >> 2U);
            }

            return color_quad_u8(cNoClamp, r, g, b, rg_etc1::minimum(alpha, 255U));
        }